

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChStream.cpp
# Opt level: O3

ChStreamInBinary * __thiscall chrono::ChStreamInBinary::operator>>(ChStreamInBinary *this,uint *Val)

{
  undefined1 uVar1;
  bool bVar2;
  undefined8 in_RAX;
  undefined1 *puVar3;
  bool bVar4;
  undefined4 *puVar5;
  uint tmp;
  undefined4 local_24;
  
  local_24 = (uint)((ulong)in_RAX >> 0x20);
  if ((this->super_ChBinaryArchive).big_endian_machine == true) {
    (*(this->super_ChStreamIn)._vptr_ChStreamIn[3])(this,&local_24,4);
    puVar3 = (undefined1 *)((long)&local_24 + 3);
    puVar5 = &local_24;
    bVar2 = true;
    do {
      bVar4 = bVar2;
      uVar1 = *(undefined1 *)puVar5;
      *(undefined1 *)puVar5 = *puVar3;
      *puVar3 = uVar1;
      puVar3 = puVar3 + -1;
      puVar5 = (undefined4 *)((long)&local_24 + 1);
      bVar2 = false;
    } while (bVar4);
    *Val = local_24;
  }
  else {
    (*(this->super_ChStreamIn)._vptr_ChStreamIn[3])(this,Val,4);
  }
  return this;
}

Assistant:

ChStreamInBinary& ChStreamInBinary::operator>>(unsigned int& Val) {
    if (big_endian_machine) {
        unsigned int tmp;
        this->Input((char*)&tmp, sizeof(unsigned int));
        StreamSwapBytes<unsigned int>(&tmp);
        Val = tmp;
    } else {
        this->Input((char*)&Val, sizeof(unsigned int));
    }
    return (*this);
}